

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O2

void __thiscall smf::MidiMessage::makePitchBend(MidiMessage *this,int channel,int lsb,int msb)

{
  undefined8 in_RAX;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,0);
  uStack_28 = CONCAT17((char)channel,(undefined7)uStack_28) & 0xeffffffffffffff | 0xe000000000000000
  ;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
             (uchar *)((long)&uStack_28 + 7));
  uStack_28 = CONCAT17(uStack_28._7_1_,CONCAT16((char)lsb,(undefined6)uStack_28)) &
              0xff7fffffffffffff;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
             (uchar *)((long)&uStack_28 + 6));
  uStack_28 = CONCAT26(uStack_28._6_2_,CONCAT15((char)msb,(undefined5)uStack_28)) &
              0xffff7fffffffffff;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
             (uchar *)((long)&uStack_28 + 5));
  return;
}

Assistant:

void MidiMessage::makePitchBend(int channel, int lsb, int msb) {
	resize(0);
	push_back(0xe0 | (0x0e & channel));
	push_back(0x7f & lsb);
	push_back(0x7f & msb);
}